

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitview.h
# Opt level: O2

void __thiscall
bv::internal::bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
set(bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *this,
   size_t begin,size_t end,word_type value)

{
  reference puVar1;
  unsigned_long value_00;
  iterator *this_00;
  ulong uVar2;
  ulong begin_00;
  ulong end_00;
  ulong begin_01;
  
  end_00 = end - begin;
  if (begin <= end && end_00 != 0) {
    size(this);
    begin_00 = (ulong)((uint)begin & 0x3f);
    uVar2 = 0x40 - begin_00;
    begin_01 = uVar2;
    if (end_00 < uVar2) {
      begin_01 = end_00;
    }
    this_00 = &(this->_container).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Deque_impl_data._M_start;
    puVar1 = std::_Deque_iterator<unsigned_long,_unsigned_long_&,_unsigned_long_*>::operator[]
                       (this_00,begin >> 6);
    set_bitfield<unsigned_long>(puVar1,begin_00,begin_01 + begin_00,value);
    if (uVar2 < end_00) {
      value_00 = bitfield<unsigned_long,void>(value,begin_01,end_00);
      puVar1 = std::_Deque_iterator<unsigned_long,_unsigned_long_&,_unsigned_long_*>::operator[]
                         (this_00,(begin >> 6) + 1);
      set_bitfield<unsigned_long>(puVar1,0,end_00 - begin_01,value_00);
      return;
    }
  }
  return;
}

Assistant:

void bitview<Container>::set(size_t begin, size_t end, word_type value)
        {
            if(is_empty_range(begin, end))
                return;
            
            size_t len = end - begin;
            
            assert(len <= W);
            check_valid_range(begin, end, size());
            ensure_bitsize(value, len);
            
            range_location_t loc = locate(begin, end);
            
            set_bitfield(_container[loc.index],
                         loc.lbegin, loc.lbegin + loc.llen, value);
            
            if(loc.hlen != 0) {
                word_type bits = bitfield(value, loc.llen, loc.llen + loc.hlen);
                set_bitfield(_container[loc.index + 1], 0, loc.hlen, bits);
            }
        }